

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

int sexp_write_utf8_char(sexp ctx,int c,sexp out)

{
  sexp psVar1;
  sexp psVar2;
  int iVar3;
  uint len;
  uchar buf [8];
  
  if (c < 0x80) {
    len = 1;
  }
  else if ((uint)c < 0x800) {
    len = 2;
  }
  else {
    len = 4 - ((uint)c < 0x10000);
  }
  sexp_utf8_encode_char(buf,len,c);
  buf[len] = '\0';
  psVar1 = (out->value).type.setters;
  if (psVar1 == (sexp)0x0) {
    iVar3 = putc((uint)buf[0],(FILE *)(out->value).type.getters);
  }
  else {
    psVar2 = (out->value).type.print;
    if (psVar2 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar2->tag + 1);
      *(uchar *)((long)&psVar2->tag + (long)&psVar1->tag) = buf[0];
      goto LAB_001132e3;
    }
    iVar3 = sexp_buffered_write_char(ctx,(uint)buf[0],out);
  }
  if (iVar3 == -1) {
    return -1;
  }
LAB_001132e3:
  if ((out->value).type.setters == (sexp)0x0) {
    fputs((char *)(buf + 1),(FILE *)(out->value).type.getters);
  }
  else {
    sexp_buffered_write_string(ctx,(char *)(buf + 1),out);
  }
  return len;
}

Assistant:

int sexp_write_utf8_char (sexp ctx, int c, sexp out) {
  unsigned char buf[8];
  int len = sexp_utf8_char_byte_count(c), i;
  sexp_utf8_encode_char(buf, len, c);
  buf[len] = 0;
  i = sexp_write_char(ctx, buf[0], out);
  if (i == EOF) return EOF;
  sexp_write_string(ctx, (char*)buf+1, out);
  return len;
}